

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O0

void __thiscall
MinVR::VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRViewportNode>::~VRConcreteItemFactory
          (VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRViewportNode> *this)

{
  void *in_RDI;
  
  ~VRConcreteItemFactory
            ((VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRViewportNode> *)0x12fc88);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~VRConcreteItemFactory() {}